

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O0

void __thiscall Option::printCurrentOption(Option *this)

{
  ostream *poVar1;
  Option *this_local;
  
  printf("Current Option : \n");
  poVar1 = std::operator<<((ostream *)&std::cout,"\thost               = ");
  poVar1 = std::operator<<(poVar1,this->server_ip_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tserver_port        = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->server_port_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\ttimeout_ms         = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->connect_timeout_ms_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tconcurrent_num     = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->concurrent_num_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tis_keep_alive      = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(this->is_keep_alive_ & 1));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tthread_num         = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->thread_num_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tduration           = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->duration_);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tinterval_time_s    = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->interval_time_s_);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void Option::printCurrentOption()
{
    printf("Current Option : \n");
    std::cout << "\thost               = " << server_ip_ << "\n" << "\tserver_port        = " << server_port_ << "\n"
              << "\ttimeout_ms         = " << connect_timeout_ms_ << "\n" << "\tconcurrent_num     = "
              << concurrent_num_ << "\n" << "\tis_keep_alive      = " << is_keep_alive_ << "\n"
              << "\tthread_num         = " << thread_num_ << "\n" << "\tduration           = " << duration_ << "\n"
              << "\tinterval_time_s    = " << interval_time_s_ << "\n";
}